

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

uint16_t SSL_get_dtls_write_epoch(SSL *ssl)

{
  uint16_t uVar1;
  int iVar2;
  SSL *ssl_local;
  
  iVar2 = SSL_is_dtls(ssl);
  if (iVar2 == 0) {
    abort();
  }
  uVar1 = bssl::DTLSWriteEpoch::epoch(&ssl->d1->write_epoch);
  return uVar1;
}

Assistant:

uint16_t SSL_get_dtls_write_epoch(const SSL *ssl) {
  BSSL_CHECK(SSL_is_dtls(ssl));
  return ssl->d1->write_epoch.epoch();
}